

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

matrix3d * tinyusdz::to_matrix3x3(matrix3d *__return_storage_ptr__,quatf *q)

{
  const_reference pvVar1;
  V *this;
  double *__src;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  vec<double,_4> local_78;
  undefined1 local_58 [8];
  double3x3 m33;
  quatf *q_local;
  
  m33.z.z = (double)q;
  pvVar1 = ::std::array<float,_3UL>::operator[](&q->imag,0);
  local_80 = (double)*pvVar1;
  pvVar1 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)m33.z.z,1);
  local_88 = (double)*pvVar1;
  pvVar1 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)m33.z.z,2);
  local_90 = (double)*pvVar1;
  local_98 = (double)*(float *)((long)m33.z.z + 0xc);
  linalg::vec<double,_4>::vec(&local_78,&local_80,&local_88,&local_90,&local_98);
  linalg::qmat<double>((mat<double,_3,_3> *)local_58,&local_78);
  value::matrix3d::matrix3d(__return_storage_ptr__);
  Identity(__return_storage_ptr__);
  this = linalg::mat<double,_3,_3>::operator[]((mat<double,_3,_3> *)local_58,0);
  __src = linalg::vec<double,_3>::operator[](this,0);
  memcpy(__return_storage_ptr__,__src,0x48);
  return __return_storage_ptr__;
}

Assistant:

value::matrix3d to_matrix3x3(const value::quatf &q) {
  double3x3 m33 = linalg::qmat<double>({double(q.imag[0]), double(q.imag[1]),
                                        double(q.imag[2]), double(q.real)});

  value::matrix3d m;
  Identity(&m);

  memcpy(m.m, &m33[0][0], sizeof(double) * 3 * 3);

  return m;
}